

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

void __thiscall ImplicitDepLoader::CreatePhonyInEdge(ImplicitDepLoader *this,Node *node)

{
  Edge *pEVar1;
  Node *local_20;
  
  if (node->in_edge_ == (Edge *)0x0) {
    local_20 = node;
    pEVar1 = State::AddEdge(this->state_,&State::kPhonyRule);
    pEVar1->generated_by_dep_loader_ = true;
    node->in_edge_ = pEVar1;
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&pEVar1->outputs_,&local_20);
    pEVar1->outputs_ready_ = true;
  }
  return;
}

Assistant:

void ImplicitDepLoader::CreatePhonyInEdge(Node* node) {
  if (node->in_edge())
    return;

  Edge* phony_edge = state_->AddEdge(&State::kPhonyRule);
  phony_edge->generated_by_dep_loader_ = true;
  node->set_in_edge(phony_edge);
  phony_edge->outputs_.push_back(node);

  // RecomputeDirty might not be called for phony_edge if a previous call
  // to RecomputeDirty had caused the file to be stat'ed.  Because previous
  // invocations of RecomputeDirty would have seen this node without an
  // input edge (and therefore ready), we have to set outputs_ready_ to true
  // to avoid a potential stuck build.  If we do call RecomputeDirty for
  // this node, it will simply set outputs_ready_ to the correct value.
  phony_edge->outputs_ready_ = true;
}